

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O1

int __thiscall ncnn::Convolution_x86::create_pipeline(Convolution_x86 *this,Option *opt)

{
  int iVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  int *piVar4;
  void *pvVar5;
  long *plVar6;
  ulong uVar7;
  Layer *pLVar8;
  int iVar9;
  long lVar10;
  int kernel_size;
  Mat *_kernel;
  int iVar11;
  float fVar12;
  Mat weights [2];
  ParamDict pd;
  ModelBinFromMatArray MStack_9b8;
  Mat local_9a8;
  Mat local_968;
  ParamDict local_920;
  
  switch(*(undefined4 *)
          ((long)&(this->weight_3x3_winograd23_data_int8).c + (long)this->_vptr_Convolution_x86[-3])
        ) {
  case 1:
    pLVar8 = create_layer(0x1a);
    this->activation = pLVar8;
    ParamDict::ParamDict(&local_920);
    (*this->activation->_vptr_Layer[2])(this->activation,&local_920);
    lVar10 = 0x8c0;
    do {
      piVar4 = *(int **)((long)&local_920.params[0].v.data + lVar10);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          pvVar5 = *(void **)((long)&local_920.params[0].type + lVar10);
          plVar6 = *(long **)((long)&local_920.params[0].v.elempack + lVar10);
          if (plVar6 == (long *)0x0) {
            if (pvVar5 != (void *)0x0) {
              free(pvVar5);
            }
          }
          else {
            (**(code **)(*plVar6 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_920.params[0].v.data + lVar10 + 4) = 0;
      *(undefined8 *)((long)&local_920.params[0].v.refcount + lVar10 + 4) = 0;
      *(undefined8 *)((long)&local_920.params[0].type + lVar10) = 0;
      *(undefined8 *)((long)&local_920.params[0].v.data + lVar10) = 0;
      *(undefined8 *)((long)&local_920.params[0].v.allocator + lVar10) = 0;
      *(undefined8 *)((long)&local_920.params[0].v.dims + lVar10) = 0;
      *(undefined8 *)((long)&local_920.params[0].v.h + lVar10) = 0;
      lVar10 = lVar10 + -0x48;
    } while (lVar10 != -0x40);
    break;
  case 2:
    pLVar8 = create_layer(0x1a);
    this->activation = pLVar8;
    ParamDict::ParamDict(&local_920);
    ParamDict::set(&local_920,0,
                   **(float **)
                     ((long)&(this->weight_3x3_winograd23_data_int8).cstep +
                     (long)this->_vptr_Convolution_x86[-3]));
    (*this->activation->_vptr_Layer[2])(this->activation,&local_920);
    lVar10 = 0x8c0;
    do {
      piVar4 = *(int **)((long)&local_920.params[0].v.data + lVar10);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          pvVar5 = *(void **)((long)&local_920.params[0].type + lVar10);
          plVar6 = *(long **)((long)&local_920.params[0].v.elempack + lVar10);
          if (plVar6 == (long *)0x0) {
            if (pvVar5 != (void *)0x0) {
              free(pvVar5);
            }
          }
          else {
            (**(code **)(*plVar6 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_920.params[0].v.data + lVar10 + 4) = 0;
      *(undefined8 *)((long)&local_920.params[0].v.refcount + lVar10 + 4) = 0;
      *(undefined8 *)((long)&local_920.params[0].type + lVar10) = 0;
      *(undefined8 *)((long)&local_920.params[0].v.data + lVar10) = 0;
      *(undefined8 *)((long)&local_920.params[0].v.allocator + lVar10) = 0;
      *(undefined8 *)((long)&local_920.params[0].v.dims + lVar10) = 0;
      *(undefined8 *)((long)&local_920.params[0].v.h + lVar10) = 0;
      lVar10 = lVar10 + -0x48;
    } while (lVar10 != -0x40);
    break;
  case 3:
    pLVar8 = create_layer(0x36);
    this->activation = pLVar8;
    ParamDict::ParamDict(&local_920);
    p_Var3 = this->_vptr_Convolution_x86[-3];
    fVar12 = **(float **)((long)&(this->weight_3x3_winograd23_data_int8).cstep + (long)p_Var3);
    if ((&this->field_0x200)[(long)p_Var3] == '\x01') {
      ParamDict::set(&local_920,0,fVar12 * *(float *)(&this->field_0x1fc + (long)p_Var3));
      fVar12 = *(float *)(&this->field_0x1fc + (long)this->_vptr_Convolution_x86[-3]) *
               *(float *)(*(long *)((long)&(this->weight_3x3_winograd23_data_int8).cstep +
                                   (long)this->_vptr_Convolution_x86[-3]) + 4);
    }
    else {
      ParamDict::set(&local_920,0,fVar12);
      fVar12 = *(float *)(*(long *)((long)&(this->weight_3x3_winograd23_data_int8).cstep +
                                   (long)this->_vptr_Convolution_x86[-3]) + 4);
    }
    ParamDict::set(&local_920,1,fVar12);
    (*this->activation->_vptr_Layer[2])(this->activation,&local_920);
    lVar10 = 0x8c0;
    do {
      piVar4 = *(int **)((long)&local_920.params[0].v.data + lVar10);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          pvVar5 = *(void **)((long)&local_920.params[0].type + lVar10);
          plVar6 = *(long **)((long)&local_920.params[0].v.elempack + lVar10);
          if (plVar6 == (long *)0x0) {
            if (pvVar5 != (void *)0x0) {
              free(pvVar5);
            }
          }
          else {
            (**(code **)(*plVar6 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_920.params[0].v.data + lVar10 + 4) = 0;
      *(undefined8 *)((long)&local_920.params[0].v.refcount + lVar10 + 4) = 0;
      *(undefined8 *)((long)&local_920.params[0].type + lVar10) = 0;
      *(undefined8 *)((long)&local_920.params[0].v.data + lVar10) = 0;
      *(undefined8 *)((long)&local_920.params[0].v.allocator + lVar10) = 0;
      *(undefined8 *)((long)&local_920.params[0].v.dims + lVar10) = 0;
      *(undefined8 *)((long)&local_920.params[0].v.h + lVar10) = 0;
      lVar10 = lVar10 + -0x48;
    } while (lVar10 != -0x40);
    break;
  case 4:
    pLVar8 = create_layer(0x1e);
    this->activation = pLVar8;
    ParamDict::ParamDict(&local_920);
    (*this->activation->_vptr_Layer[2])(this->activation,&local_920);
    lVar10 = 0x8c0;
    do {
      piVar4 = *(int **)((long)&local_920.params[0].v.data + lVar10);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          pvVar5 = *(void **)((long)&local_920.params[0].type + lVar10);
          plVar6 = *(long **)((long)&local_920.params[0].v.elempack + lVar10);
          if (plVar6 == (long *)0x0) {
            if (pvVar5 != (void *)0x0) {
              free(pvVar5);
            }
          }
          else {
            (**(code **)(*plVar6 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_920.params[0].v.data + lVar10 + 4) = 0;
      *(undefined8 *)((long)&local_920.params[0].v.refcount + lVar10 + 4) = 0;
      *(undefined8 *)((long)&local_920.params[0].type + lVar10) = 0;
      *(undefined8 *)((long)&local_920.params[0].v.data + lVar10) = 0;
      *(undefined8 *)((long)&local_920.params[0].v.allocator + lVar10) = 0;
      *(undefined8 *)((long)&local_920.params[0].v.dims + lVar10) = 0;
      *(undefined8 *)((long)&local_920.params[0].v.h + lVar10) = 0;
      lVar10 = lVar10 + -0x48;
    } while (lVar10 != -0x40);
    break;
  case 5:
    pLVar8 = create_layer(0x47);
    this->activation = pLVar8;
    ParamDict::ParamDict(&local_920);
    (*this->activation->_vptr_Layer[2])(this->activation,&local_920);
    lVar10 = 0x8c0;
    do {
      piVar4 = *(int **)((long)&local_920.params[0].v.data + lVar10);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          pvVar5 = *(void **)((long)&local_920.params[0].type + lVar10);
          plVar6 = *(long **)((long)&local_920.params[0].v.elempack + lVar10);
          if (plVar6 == (long *)0x0) {
            if (pvVar5 != (void *)0x0) {
              free(pvVar5);
            }
          }
          else {
            (**(code **)(*plVar6 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_920.params[0].v.data + lVar10 + 4) = 0;
      *(undefined8 *)((long)&local_920.params[0].v.refcount + lVar10 + 4) = 0;
      *(undefined8 *)((long)&local_920.params[0].type + lVar10) = 0;
      *(undefined8 *)((long)&local_920.params[0].v.data + lVar10) = 0;
      *(undefined8 *)((long)&local_920.params[0].v.allocator + lVar10) = 0;
      *(undefined8 *)((long)&local_920.params[0].v.dims + lVar10) = 0;
      *(undefined8 *)((long)&local_920.params[0].v.h + lVar10) = 0;
      lVar10 = lVar10 + -0x48;
    } while (lVar10 != -0x40);
  }
  pLVar8 = this->activation;
  if (pLVar8 != (Layer *)0x0) {
    (*pLVar8->_vptr_Layer[4])(pLVar8,opt);
  }
  if ((opt->use_int8_inference == true) &&
     (*(long *)(&this->field_0x148 + (long)this->_vptr_Convolution_x86[-3]) == 1)) {
    create_pipeline_int8_x86(this,opt);
  }
  else {
    pp_Var2 = this->_vptr_Convolution_x86;
    p_Var3 = pp_Var2[-3];
    kernel_size = *(int *)((long)&(this->weight_3x3_winograd23_data_int8).data + (long)p_Var3) *
                  *(int *)(&this->field_0xbc + (long)p_Var3);
    uVar7 = (long)*(int *)((long)&(this->weight_3x3_winograd23_data_int8).w + (long)p_Var3) /
            (long)kernel_size;
    iVar11 = *(int *)(&this->use_winograd3x3_int8 + (long)p_Var3);
    this->use_winograd3x3 = false;
    p_Var3 = pp_Var2[-3];
    iVar9 = *(int *)((long)&(this->weight_3x3_winograd23_data_int8).data + (long)p_Var3);
    if (((*(int *)(&this->field_0xbc + (long)p_Var3) == iVar9) &&
        (((iVar1 = *(int *)((long)&(this->weight_3x3_winograd23_data_int8).data + (long)(p_Var3 + 4)
                           ), iVar1 != 1 &&
          (*(int *)((long)&(this->weight_3x3_winograd23_data_int8).refcount + (long)p_Var3) == iVar1
          )) && (*(int *)((long)&(this->weight_3x3_winograd23_data_int8).refcount +
                         (long)(p_Var3 + 4)) == 1)))) &&
       (*(int *)((long)&(this->weight_3x3_winograd23_data_int8).elemsize + (long)p_Var3) == 1)) {
      pLVar8 = create_layer(6);
      this->convolution_dilation1 = pLVar8;
      ParamDict::ParamDict(&local_920);
      ParamDict::set(&local_920,0,
                     *(int *)(&this->use_winograd3x3_int8 + (long)this->_vptr_Convolution_x86[-3]));
      ParamDict::set(&local_920,1,
                     *(int *)(&this->field_0xbc + (long)this->_vptr_Convolution_x86[-3]));
      ParamDict::set(&local_920,0xb,
                     *(int *)((long)&(this->weight_3x3_winograd23_data_int8).data +
                             (long)this->_vptr_Convolution_x86[-3]));
      ParamDict::set(&local_920,2,1);
      ParamDict::set(&local_920,0xc,1);
      ParamDict::set(&local_920,3,1);
      ParamDict::set(&local_920,0xd,1);
      ParamDict::set(&local_920,4,0);
      ParamDict::set(&local_920,0xe,0);
      ParamDict::set(&local_920,5,
                     *(int *)((long)&(this->weight_3x3_winograd23_data_int8).dims +
                             (long)this->_vptr_Convolution_x86[-3]));
      ParamDict::set(&local_920,6,
                     *(int *)((long)&(this->weight_3x3_winograd23_data_int8).w +
                             (long)this->_vptr_Convolution_x86[-3]));
      (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&local_920);
      pp_Var2 = this->_vptr_Convolution_x86;
      if (*(int *)((long)&(this->weight_3x3_winograd23_data_int8).dims + (long)pp_Var2[-3]) == 0) {
        local_9a8.elemsize._0_4_ = 0;
        local_9a8._20_8_ = 0;
        local_9a8.data = (void *)0x0;
        local_9a8.refcount._0_4_ = 0;
        local_9a8.refcount._4_4_ = 0;
        local_9a8.allocator = (Allocator *)0x0;
        local_9a8.dims = 0;
        local_9a8.w = 0;
        local_9a8.h = 0;
        local_9a8.c = 0;
        local_9a8.cstep = 0;
        Mat::operator=(&local_9a8,(Mat *)(&this->field_0x138 + (long)pp_Var2[-3]));
        pLVar8 = this->convolution_dilation1;
        ModelBinFromMatArray::ModelBinFromMatArray(&MStack_9b8,&local_9a8);
        (*pLVar8->_vptr_Layer[3])(pLVar8,&MStack_9b8);
        ModelBin::~ModelBin(&MStack_9b8.super_ModelBin);
        piVar4 = (int *)CONCAT44(local_9a8.refcount._4_4_,local_9a8.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_9a8.allocator == (Allocator *)0x0) {
              if (local_9a8.data != (void *)0x0) {
                free(local_9a8.data);
              }
            }
            else {
              (**(code **)(*(long *)local_9a8.allocator + 0x18))();
            }
          }
        }
      }
      else {
        lVar10 = 0;
        do {
          *(undefined8 *)((long)&local_9a8.refcount + lVar10 + 4) = 0;
          *(undefined8 *)((long)&local_9a8.elemsize + lVar10 + 4) = 0;
          *(undefined8 *)((long)&local_9a8.data + lVar10) = 0;
          *(undefined8 *)((long)&local_9a8.refcount + lVar10) = 0;
          *(undefined8 *)((long)&local_9a8.allocator + lVar10) = 0;
          *(undefined8 *)((long)&local_9a8.dims + lVar10) = 0;
          *(undefined8 *)((long)&local_9a8.h + lVar10) = 0;
          *(undefined8 *)((long)&local_9a8.cstep + lVar10) = 0;
          lVar10 = lVar10 + 0x40;
        } while (lVar10 != 0x80);
        Mat::operator=(&local_9a8,(Mat *)(&this->field_0x138 + (long)pp_Var2[-3]));
        Mat::operator=(&local_968,
                       (Mat *)(&this->field_0x178 + (long)this->_vptr_Convolution_x86[-3]));
        pLVar8 = this->convolution_dilation1;
        ModelBinFromMatArray::ModelBinFromMatArray(&MStack_9b8,&local_9a8);
        (*pLVar8->_vptr_Layer[3])(pLVar8,&MStack_9b8);
        ModelBin::~ModelBin(&MStack_9b8.super_ModelBin);
        lVar10 = 0x40;
        do {
          piVar4 = *(int **)((long)&local_9a8.refcount + lVar10);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar5 = *(void **)((long)&local_9a8.data + lVar10);
              plVar6 = *(long **)((long)&local_9a8.allocator + lVar10);
              if (plVar6 == (long *)0x0) {
                if (pvVar5 != (void *)0x0) {
                  free(pvVar5);
                }
              }
              else {
                (**(code **)(*plVar6 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_9a8.refcount + lVar10 + 4) = 0;
          *(undefined8 *)((long)&local_9a8.elemsize + lVar10 + 4) = 0;
          *(undefined8 *)((long)&local_9a8.data + lVar10) = 0;
          *(undefined8 *)((long)&local_9a8.refcount + lVar10) = 0;
          *(undefined8 *)((long)&local_9a8.dims + lVar10) = 0;
          *(undefined8 *)((long)&local_9a8.h + lVar10) = 0;
          *(undefined8 *)((long)&local_9a8.cstep + lVar10) = 0;
          lVar10 = lVar10 + -0x40;
        } while (lVar10 != -0x40);
      }
      (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
      lVar10 = 0x8c0;
      do {
        piVar4 = *(int **)((long)&local_920.params[0].v.data + lVar10);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pvVar5 = *(void **)((long)&local_920.params[0].type + lVar10);
            plVar6 = *(long **)((long)&local_920.params[0].v.elempack + lVar10);
            if (plVar6 == (long *)0x0) {
              if (pvVar5 != (void *)0x0) {
                free(pvVar5);
              }
            }
            else {
              (**(code **)(*plVar6 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_920.params[0].v.data + lVar10 + 4) = 0;
        *(undefined8 *)((long)&local_920.params[0].v.refcount + lVar10 + 4) = 0;
        *(undefined8 *)((long)&local_920.params[0].type + lVar10) = 0;
        *(undefined8 *)((long)&local_920.params[0].v.data + lVar10) = 0;
        *(undefined8 *)((long)&local_920.params[0].v.allocator + lVar10) = 0;
        *(undefined8 *)((long)&local_920.params[0].v.dims + lVar10) = 0;
        *(undefined8 *)((long)&local_920.params[0].v.h + lVar10) = 0;
        lVar10 = lVar10 + -0x48;
      } while (lVar10 != -0x40);
    }
    else {
      iVar11 = (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                    (long)iVar11);
      if ((((iVar9 == 3) && (*(int *)(&this->field_0xbc + (long)p_Var3) == 3)) &&
          ((opt->use_winograd_convolution != false &&
           ((*(int *)((long)&(this->weight_3x3_winograd23_data_int8).data + (long)(p_Var3 + 4)) == 1
            && (*(int *)((long)&(this->weight_3x3_winograd23_data_int8).refcount + (long)p_Var3) ==
                1)))))) &&
         ((*(int *)((long)&(this->weight_3x3_winograd23_data_int8).refcount + (long)(p_Var3 + 4)) ==
           1 && (((*(int *)((long)&(this->weight_3x3_winograd23_data_int8).elemsize + (long)p_Var3)
                   == 1 && (0xf < iVar11)) &&
                 (0xf < *(int *)(&this->use_winograd3x3_int8 + (long)p_Var3))))))) {
        this->use_winograd3x3 = true;
        conv3x3s1_winograd23_transform_kernel_sse
                  ((Mat *)(&this->field_0x138 + (long)pp_Var2[-3]),&this->weight_3x3_winograd23_data
                   ,iVar11,*(int *)(&this->use_winograd3x3_int8 + (long)pp_Var2[-3]));
        _kernel = (Mat *)(&this->field_0x138 + (long)this->_vptr_Convolution_x86[-3]);
        iVar9 = *(int *)(&this->use_winograd3x3_int8 + (long)this->_vptr_Convolution_x86[-3]);
      }
      else {
        iVar9 = *(int *)(&this->use_winograd3x3_int8 + (long)p_Var3);
        _kernel = (Mat *)(&this->field_0x138 + (long)p_Var3);
      }
      conv_im2col_sgemm_transform_kernel_sse
                (_kernel,&this->weight_sgemm_data,iVar11,iVar9,kernel_size);
    }
  }
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline(const Option& opt)
{
    if (activation_type == 1)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }
    else if (activation_type == 2)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]);// slope
        activation->load_param(pd);
    }
    else if (activation_type == 3)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Clip);

        ncnn::ParamDict pd;
        if (use_int8_requantize)
        {
            pd.set(0, activation_params[0] * top_blob_int8_scale);// min
            pd.set(1, activation_params[1] * top_blob_int8_scale);// max
        }else{
            pd.set(0, activation_params[0]);// min
            pd.set(1, activation_params[1]);// max
        }

        activation->load_param(pd);
    }
    else if (activation_type == 4)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Sigmoid);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }
    else if (activation_type == 5)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Mish);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }

    if (activation)
    {
        activation->create_pipeline(opt);
    }

    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    use_winograd3x3 = false;

    if (kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output);// num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);// stride_w
        pd.set(13, 1);// stride_h
        pd.set(4, 0);// pad_w
        pd.set(14, 0);// pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);
    }
    else if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1
        && num_input >= 16 && num_output >= 16)
    {
        // winograd is slow on small channel count
        use_winograd3x3 = true;

        conv3x3s1_winograd23_transform_kernel_sse(weight_data, weight_3x3_winograd23_data, num_input, num_output);
//         conv3x3s1_winograd43_transform_kernel_sse(weight_data, weight_3x3_winograd43_data, num_input, num_output);

        // for small size
        conv_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_size);
    }
    else
    {
        conv_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_size);
    }

    return 0;
}